

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O0

void soa_fsa_init(soa_fsa_t *allocator,size_t blockSize,uchar numBlocks)

{
  uchar numBlocks_local;
  size_t blockSize_local;
  soa_fsa_t *allocator_local;
  
  allocator->blockSize = blockSize;
  allocator->numBlocks = numBlocks;
  allocator->allocChunk = (soa_chunk_t *)0x0;
  allocator->deallocChunk = (soa_chunk_t *)0x0;
  allocator->chunks_len = 0;
  allocator->chunks = (soa_chunk_t *)0x0;
  return;
}

Assistant:

void soa_fsa_init( soa_fsa_t *allocator,size_t blockSize, unsigned char numBlocks )
{  
  allocator->blockSize = blockSize;
  allocator->numBlocks = numBlocks;
  allocator->allocChunk = 0;
  allocator->deallocChunk = 0;
  allocator->chunks_len = 0;
  allocator->chunks = 0;
}